

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5TokendataIterNext(Fts5Iter *pIter,int bFrom,i64 iFrom)

{
  long in_RDX;
  int in_ESI;
  long *in_RDI;
  Fts5Iter *p;
  Fts5Index *pIndex;
  Fts5TokenDataIter *pT;
  int ii;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  bool bVar1;
  long *plVar2;
  Fts5Iter *pIter_00;
  Fts5Index *p_00;
  int local_1c;
  
  p_00 = (Fts5Index *)in_RDI[3];
  pIter_00 = (Fts5Iter *)in_RDI[4];
  for (local_1c = 0; local_1c < p_00->nPendingData; local_1c = local_1c + 1) {
    plVar2 = *(long **)(&p_00->nPendingRow + (long)local_1c * 2);
    if ((*(char *)((long)plVar2 + 0x14) == '\0') &&
       ((*plVar2 == *in_RDI || ((in_ESI != 0 && (*plVar2 < in_RDX)))))) {
      fts5MultiIterNext(p_00,pIter_00,(int)((ulong)plVar2 >> 0x20),
                        CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      while( true ) {
        bVar1 = false;
        if (((in_ESI != 0) && (bVar1 = false, *(char *)((long)plVar2 + 0x14) == '\0')) &&
           (bVar1 = false, *plVar2 < in_RDX)) {
          bVar1 = *(int *)((long)&pIter_00->pColset + 4) == 0;
        }
        if (bVar1 == false) break;
        fts5MultiIterNext(p_00,pIter_00,(int)((ulong)plVar2 >> 0x20),
                          CONCAT17(bVar1,in_stack_ffffffffffffffc0));
      }
      in_stack_ffffffffffffffc7 = 0;
    }
  }
  if (*(int *)((long)&pIter_00->pColset + 4) == 0) {
    fts5IterSetOutputsTokendata(p);
  }
  return;
}

Assistant:

static void fts5TokendataIterNext(Fts5Iter *pIter, int bFrom, i64 iFrom){
  int ii;
  Fts5TokenDataIter *pT = pIter->pTokenDataIter;
  Fts5Index *pIndex = pIter->pIndex;

  for(ii=0; ii<pT->nIter; ii++){
    Fts5Iter *p = pT->apIter[ii];
    if( p->base.bEof==0
     && (p->base.iRowid==pIter->base.iRowid || (bFrom && p->base.iRowid<iFrom))
    ){
      fts5MultiIterNext(pIndex, p, bFrom, iFrom);
      while( bFrom && p->base.bEof==0
          && p->base.iRowid<iFrom
          && pIndex->rc==SQLITE_OK
      ){
        fts5MultiIterNext(pIndex, p, 0, 0);
      }
    }
  }

  if( pIndex->rc==SQLITE_OK ){
    fts5IterSetOutputsTokendata(pIter);
  }
}